

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::ComputeFeasabilityViolation
          (ChSystemDescriptor *this,double *resulting_maxviolation,double *resulting_feasability)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  
  *resulting_maxviolation = 0.0;
  *resulting_feasability = 0.0;
  lVar2 = (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    lVar3 = 0;
    do {
      auVar6 = in_ZMM0._0_16_;
      (*(this->vconstraints).
        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3]->_vptr_ChConstraint[5])();
      dVar5 = auVar6._0_8_;
      (*(this->vconstraints).
        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3]->_vptr_ChConstraint[0xc])();
      auVar4._8_8_ = 0x7fffffffffffffff;
      auVar4._0_8_ = 0x7fffffffffffffff;
      auVar4 = vandpd_avx512vl(auVar6,auVar4);
      in_ZMM0 = ZEXT1664(auVar4);
      if (*resulting_maxviolation < auVar4._0_8_) {
        *resulting_maxviolation = auVar4._0_8_;
      }
      iVar1 = (*(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar3]->_vptr_ChConstraint[3])();
      if ((char)iVar1 != '\0') {
        auVar6._8_8_ = 0x7fffffffffffffff;
        auVar6._0_8_ = 0x7fffffffffffffff;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar5 * (this->vconstraints).
                               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar3]->l_i;
        auVar4 = vandpd_avx512vl(auVar7,auVar6);
        in_ZMM0 = ZEXT1664(auVar4);
        if (*resulting_feasability < auVar4._0_8_) {
          *resulting_feasability = auVar4._0_8_;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return;
}

Assistant:

void ChSystemDescriptor::ComputeFeasabilityViolation(double& resulting_maxviolation, double& resulting_feasability) {
    resulting_maxviolation = 0;
    resulting_feasability = 0;

    auto vc_size = vconstraints.size();

    for (size_t ic = 0; ic < vc_size; ic++) {
        // the the residual of the constraint..
        double mres_i = vconstraints[ic]->Compute_c_i();

        double candidate_violation = fabs(vconstraints[ic]->Violation(mres_i));

        if (candidate_violation > resulting_maxviolation)
            resulting_maxviolation = candidate_violation;

        if (vconstraints[ic]->IsUnilateral()) {
            double candidate_feas = fabs(mres_i * vconstraints[ic]->Get_l_i());  // =|c*l|
            if (candidate_feas > resulting_feasability)
                resulting_feasability = candidate_feas;
        }
    }
}